

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswDyn.c
# Opt level: O2

void Ssw_ManLabelPiNodes(Ssw_Man_t *p)

{
  undefined1 *puVar1;
  ulong uVar2;
  uint __line;
  void *pvVar3;
  int i;
  char *__assertion;
  int iVar4;
  
  puVar1 = &p->pFrames->pConst1->field_0x18;
  *(ulong *)puVar1 = *(ulong *)puVar1 | 0x10;
  puVar1 = &p->pFrames->pConst1->field_0x18;
  *(ulong *)puVar1 = *(ulong *)puVar1 | 0x20;
  iVar4 = 0;
  do {
    if (p->nFrames <= iVar4) {
      return;
    }
    for (i = 0; i < p->pAig->nTruePis; i = i + 1) {
      pvVar3 = Vec_PtrEntry(p->pAig->vCis,i);
      uVar2 = *(ulong *)&p->pNodeToFrames[*(int *)((long)pvVar3 + 0x24) * p->nFrames + iVar4]->
                         field_0x18;
      if (((uint)uVar2 & 7) != 2) {
        __assertion = "Aig_ObjIsCi(pObjFrames)";
        __line = 0x39;
LAB_0055f5d9:
        __assert_fail(__assertion,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/ssw/sswDyn.c"
                      ,__line,"void Ssw_ManLabelPiNodes(Ssw_Man_t *)");
      }
      if ((uVar2 & 0x20) != 0) {
        __assertion = "pObjFrames->fMarkB == 0";
        __line = 0x3a;
        goto LAB_0055f5d9;
      }
      *(ulong *)&p->pNodeToFrames[*(int *)((long)pvVar3 + 0x24) * p->nFrames + iVar4]->field_0x18 =
           uVar2 | 0x30;
    }
    iVar4 = iVar4 + 1;
  } while( true );
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Label PIs nodes of the frames corresponding to PIs of AIG.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
void Ssw_ManLabelPiNodes( Ssw_Man_t * p )
{
    Aig_Obj_t * pObj, * pObjFrames;
    int f, i;
    Aig_ManConst1( p->pFrames )->fMarkA = 1;
    Aig_ManConst1( p->pFrames )->fMarkB = 1;
    for ( f = 0; f < p->nFrames; f++ )
    {
        Saig_ManForEachPi( p->pAig, pObj, i )
        {
            pObjFrames = Ssw_ObjFrame( p, pObj, f );
            assert( Aig_ObjIsCi(pObjFrames) );
            assert( pObjFrames->fMarkB == 0 );
            pObjFrames->fMarkA = 1;
            pObjFrames->fMarkB = 1;
        }
    }
}